

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedExe.cpp
# Opt level: O3

QString * __thiscall
ExeWrappersContainer::getWrapperName
          (QString *__return_storage_ptr__,ExeWrappersContainer *this,size_t id)

{
  _Base_ptr p_Var1;
  mapped_type *ppEVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  QByteArrayView QVar5;
  size_t local_30;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  p_Var1 = (this->wrappers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_30 = id;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var4 = &(this->wrappers)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var4->_M_header;
    do {
      if (*(ulong *)(p_Var1 + 1) >= id) {
        p_Var3 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < id];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var4) && (*(ulong *)(p_Var3 + 1) <= id)) {
      ppEVar2 = std::
                map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
                ::operator[](&this->wrappers,&local_30);
      (*((*ppEVar2)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                (__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  QVar5.m_data = (storage_type *)0x0;
  QVar5.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar5);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString ExeWrappersContainer::getWrapperName(size_t id)
{
    if (wrappers.find(id) == wrappers.end()) return "";
    return wrappers[id]->getName();
}